

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void bb_max_clq(void)

{
  int iVar1;
  bool bVar2;
  size_t __result_2;
  _Elt_pointer pbVar3;
  size_t __result_1;
  long lVar4;
  size_t __i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Elt_pointer this;
  Vset *pVVar8;
  ulong uVar9;
  size_t __result;
  _WordT *p_Var10;
  byte bVar11;
  _WordT a_Stack_1dd8 [236];
  ulong local_1678;
  void *local_1670;
  Vset *local_1668;
  void *local_1660;
  ulong local_1658;
  ulong local_1650;
  _Elt_pointer local_1648;
  ulong local_1640;
  bb_content local_1638;
  
  bVar11 = 0;
  bVar2 = KDefectiveMADEC::TimeIsUp(controller);
  if (bVar2) {
    std::deque<bb_content,_std::allocator<bb_content>_>::pop_back(&bb_stack.c);
    return;
  }
  if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    this = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node[-1];
    pbVar3 = this + 1;
  }
  else {
    this = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + -1;
    pbVar3 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  }
  TREE_SIZE = TREE_SIZE + 1;
  local_1668 = &pbVar3[-1].C;
  lVar4 = -0x1d6;
  local_1678 = 0;
  do {
    uVar5 = (pbVar3->P).super__Base_bitset<235UL>._M_w[lVar4];
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    local_1678 = local_1678 +
                 (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    lVar4 = lVar4 + 1;
  } while (lVar4 != -0xeb);
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)(local_1678 << 0x20)) {
    uVar5 = (long)(local_1678 << 0x20) >> 0x1e;
  }
  local_1670 = operator_new__(uVar5);
  uVar9 = local_1678;
  local_1660 = operator_new__(uVar5);
  pVVar8 = local_1668;
  p_Var10 = a_Stack_1dd8;
  for (lVar4 = 0xeb; lVar4 != 0; lVar4 = lVar4 + -1) {
    *p_Var10 = (pVVar8->super__Base_bitset<235UL>)._M_w[0];
    pVVar8 = (Vset *)((long)pVVar8 + (ulong)bVar11 * -0x10 + 8);
    p_Var10 = p_Var10 + (ulong)bVar11 * -2 + 1;
  }
  bb_color(local_1670,local_1660);
  if (0 < (int)(uint)uVar9) {
    uVar5 = (ulong)((uint)uVar9 & 0x7fffffff);
    do {
      lVar6 = 0;
      lVar4 = 0;
      do {
        uVar9 = (this->P).super__Base_bitset<235UL>._M_w[lVar6];
        uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
        uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
        lVar4 = lVar4 + (((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xeb);
      if ((ulong)(lVar4 + *(int *)((long)local_1660 + uVar5 * 4 + -4)) <= (ulong)(long)LB) break;
      local_1648 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
      if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        local_1648 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      pVVar8 = &local_1648[-1].nC;
      local_1678 = uVar5 - 1;
      local_1650 = (long)LB;
      local_1640 = uVar5;
      memcpy(pVVar8,local_1668,0x758);
      iVar1 = *(int *)((long)local_1670 + local_1678 * 4);
      uVar5 = (ulong)iVar1;
      if (14999 < uVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,15000);
      }
      p_Var10 = (this->P).super__Base_bitset<235UL>._M_w + (uVar5 >> 6);
      *p_Var10 = *p_Var10 | 1L << ((byte)iVar1 & 0x3f);
      lVar4 = 0;
      do {
        p_Var10 = (pVVar8->super__Base_bitset<235UL>)._M_w + lVar4;
        *p_Var10 = *p_Var10 & N[uVar5].super__Base_bitset<235UL>._M_w[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xeb);
      lVar4 = 0;
      uVar9 = 0;
      do {
        uVar7 = (this->P).super__Base_bitset<235UL>._M_w[lVar4];
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar9 = uVar9 + (((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xeb);
      local_1658 = uVar5;
      if (local_1650 < uVar9) {
        bb_max_clq();
      }
      if ((pVVar8->super__Base_bitset<235UL>)._M_w[0] == 0) {
        uVar5 = 0xffffffffffffffff;
        do {
          if (uVar5 == 0xe9) goto LAB_00116539;
          uVar9 = uVar5 + 1;
          lVar4 = uVar5 * 8;
          uVar5 = uVar9;
        } while (*(long *)((long)local_1648 + lVar4 + -0x748) == 0);
        if (uVar9 < 0xea) goto LAB_00116478;
      }
      else {
LAB_00116478:
        memcpy(&local_1638,this,0x758);
        memcpy(&local_1638.C,pVVar8,0x758);
        memset(&local_1638.nC,0,0x758);
        pbVar3 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<bb_content,_std::allocator<bb_content>_>::_M_push_back_aux<bb_content>
                    (&bb_stack.c,&local_1638);
        }
        else {
          memcpy(bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur,&local_1638,0x1608);
          bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = pbVar3 + 1;
        }
        bb_max_clq();
      }
LAB_00116539:
      uVar5 = local_1658;
      std::bitset<15000UL>::reset(&this->P,local_1658);
      std::bitset<15000UL>::reset(local_1668,uVar5);
      uVar5 = local_1678;
    } while (1 < (long)local_1640);
  }
  operator_delete__(local_1670);
  operator_delete__(local_1660);
  std::deque<bb_content,_std::allocator<bb_content>_>::pop_back(&bb_stack.c);
  return;
}

Assistant:

void bb_max_clq() {
    if (controller -> TimeIsUp()) {
        bb_stack.pop();
        return;
    };
    Vset &P = bb_stack.top().P;
    Vset &C = bb_stack.top().C;

    ++TREE_SIZE;
    int sizeC = C.count();
    int *U = new int[sizeC];
    int *color = new int[sizeC];
    bb_color(C, U, color);
    for (int i = sizeC - 1; i >= 0; --i) {
        if (color[i] + P.count() <= LB) goto bb_finish;
        Vset &nC = bb_stack.top().nC;
        nC = C;
        int v = U[i];
        P.set(v); nC &= N[v];
        if (LB < P.count()) {
            LB = P.count();
            fprintf(stderr, "new LB: %d @ MAX CLIQUE\n", LB);
        }
        if (nC.any()) {
            bb_stack.push({P, nC, Vset()});
            bb_max_clq();
        }
        P.reset(v); C.reset(v);
    }

bb_finish:
    delete[] U;
    delete[] color;
    bb_stack.pop();
}